

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# crit.hpp
# Opt level: O3

double eval_guided_crit_weighted<float,long,tsl::robin_map<unsigned_long,double,std::hash<unsigned_long>,std::equal_to<unsigned_long>,std::allocator<std::pair<unsigned_long,double>>,false,tsl::rh::power_of_two_growth_policy<2ul>>,long_double>
                 (size_t *ix_arr,size_t st,size_t end,size_t col_num,float *Xc,long *Xc_ind,
                 long *Xc_indptr,double *buffer_arr,size_t *buffer_pos,bool as_relative_gain,
                 double *saved_xmedian,double *split_point,double *xmin,double *xmax,
                 GainCriterion criterion,double min_gain,MissingAction missing_action,
                 size_t *cols_use,size_t ncols_use,bool force_cols_use,double *X_row_major,
                 size_t ncols,double *Xr,size_t *Xr_ind,size_t *Xr_indptr,
                 robin_map<unsigned_long,_double,_std::hash<unsigned_long>,_std::equal_to<unsigned_long>,_std::allocator<std::pair<unsigned_long,_double>_>,_false,_tsl::rh::power_of_two_growth_policy<2UL>_>
                 *w)

{
  double dVar1;
  undefined1 auVar2 [16];
  size_t *psVar3;
  MissingAction MVar4;
  ulong uVar5;
  double *pdVar6;
  size_t sVar7;
  ulong *puVar8;
  size_type sVar9;
  ulong uVar10;
  double *pdVar11;
  long lVar12;
  long lVar13;
  MissingAction missing_action_00;
  ulong *puVar14;
  ulong uVar15;
  size_t row;
  bool bVar16;
  double dVar17;
  undefined1 auVar18 [16];
  undefined1 auVar19 [16];
  int iVar21;
  undefined1 auVar20 [16];
  int iVar22;
  pair<tsl::detail_robin_hash::robin_hash<std::pair<unsigned_long,_double>,_tsl::robin_map<unsigned_long,_double,_std::hash<unsigned_long>,_std::equal_to<unsigned_long>,_std::allocator<std::pair<unsigned_long,_double>_>,_false,_tsl::rh::power_of_two_growth_policy<2UL>_>::KeySelect,_tsl::robin_map<unsigned_long,_double,_std::hash<unsigned_long>,_std::equal_to<unsigned_long>,_std::allocator<std::pair<unsigned_long,_double>_>,_false,_tsl::rh::power_of_two_growth_policy<2UL>_>::ValueSelect,_std::hash<unsigned_long>,_std::equal_to<unsigned_long>,_std::allocator<std::pair<unsigned_long,_double>_>,_false,_tsl::rh::power_of_two_growth_policy<2UL>_>::robin_iterator<false>,_bool>
  pVar23;
  tuple<> local_91;
  double local_90;
  ulong local_88;
  size_type local_80;
  _Head_base<0UL,_const_unsigned_long_&,_false> local_78;
  vector<double,_std::allocator<double>_> buffer_w;
  size_t ignored;
  
  MVar4 = missing_action;
  psVar3 = buffer_pos;
  pdVar6 = buffer_arr;
  todense<float,long>(ix_arr,st,end,col_num,Xc,Xc_ind,Xc_indptr,buffer_arr);
  auVar2 = _DAT_0036e1f0;
  local_88 = end - st;
  local_80 = local_88 + 1;
  local_90 = (double)end;
  if (local_80 == 0) {
    missing_action_00 = Fail;
    if (MVar4 != Impute) {
      missing_action_00 = MVar4;
    }
  }
  else {
    uVar15 = local_88 & 0x1fffffffffffffff;
    auVar20._8_4_ = (int)uVar15;
    auVar20._0_8_ = uVar15;
    auVar20._12_4_ = (int)(uVar15 >> 0x20);
    sVar7 = 0;
    auVar20 = auVar20 ^ _DAT_0036e1f0;
    auVar19 = _DAT_0036e1e0;
    do {
      auVar18 = auVar19 ^ auVar2;
      iVar21 = auVar20._4_4_;
      iVar22 = auVar20._12_4_;
      if ((bool)(~(auVar18._4_4_ == iVar21 && auVar20._0_4_ < auVar18._0_4_ ||
                  iVar21 < auVar18._4_4_) & 1)) {
        psVar3[sVar7] = sVar7;
      }
      if ((auVar18._12_4_ != iVar22 || auVar18._8_4_ <= auVar20._8_4_) && auVar18._12_4_ <= iVar22)
      {
        psVar3[sVar7 + 1] = sVar7 + 1;
      }
      sVar7 = sVar7 + 2;
      lVar12 = auVar19._8_8_;
      auVar19._0_8_ = auVar19._0_8_ + 2;
      auVar19._8_8_ = lVar12 + 2;
    } while ((uVar15 - ((uint)local_88 & 1)) + 2 != sVar7);
    missing_action_00 = Fail;
    if (MVar4 != Impute) {
      missing_action_00 = MVar4;
    }
    if (MVar4 == Impute && local_80 != 0) {
      uVar5 = 0;
      do {
        if (0x7fefffffffffffff < (ulong)ABS(pdVar6[uVar5])) {
          uVar5 = local_80 * 4 & 0xfffffffffffffff8;
          lVar12 = 0x3f;
          if (local_80 != 0) {
            for (; local_80 >> lVar12 == 0; lVar12 = lVar12 + -1) {
            }
          }
          std::
          __introselect<unsigned_long*,long,__gnu_cxx::__ops::_Iter_comp_iter<eval_guided_crit_weighted<float,long,tsl::robin_map<unsigned_long,double,std::hash<unsigned_long>,std::equal_to<unsigned_long>,std::allocator<std::pair<unsigned_long,double>>,false,tsl::rh::power_of_two_growth_policy<2ul>>,long_double>(unsigned_long*,unsigned_long,unsigned_long,unsigned_long,float*,long*,long*,double*,unsigned_long*,bool,double*,double&,double&,double&,GainCriterion,double,MissingAction,unsigned_long*,unsigned_long,bool,double*,unsigned_long,double*,unsigned_long*,unsigned_long*,tsl::robin_map<unsigned_long,double,std::hash<unsigned_long>,std::equal_to<unsigned_long>,std::allocator<std::pair<unsigned_long,double>>,false,tsl::rh::power_of_two_growth_policy<2ul>>&)::_lambda(unsigned_long,unsigned_long)_1_>>
                    (buffer_pos,(unsigned_long *)((long)buffer_pos + uVar5),psVar3 + local_80,
                     (ulong)(((uint)lVar12 ^ 0x3f) * 2) ^ 0x7e,
                     (_Iter_comp_iter<(lambda_at__workspace_llm4binary_github_license_c_cmakelists_david_cortes[P]isotree_src_crit_hpp:3503:30)>
                      )&buffer_arr);
          auVar2 = _DAT_0036e1f0;
          dVar1 = buffer_arr[*(long *)((long)buffer_pos + uVar5)];
          *saved_xmedian = dVar1;
          if ((local_88 & 1) != 0) {
            puVar14 = buffer_pos;
            if (uVar5 != 8) {
              uVar10 = *buffer_pos;
              lVar12 = uVar5 - 8;
              puVar8 = buffer_pos;
              do {
                puVar8 = puVar8 + 1;
                uVar5 = *puVar8;
                bVar16 = uVar10 < uVar5;
                if (uVar10 <= uVar5) {
                  uVar10 = uVar5;
                }
                if (bVar16) {
                  puVar14 = puVar8;
                }
                lVar12 = lVar12 + -8;
              } while (lVar12 != 0);
            }
            dVar17 = ((double)CONCAT44(0x45300000,(int)(*puVar14 >> 0x20)) - 1.9342813113834067e+25)
                     + ((double)CONCAT44(0x43300000,(int)*puVar14) - 4503599627370496.0);
            *saved_xmedian = (dVar1 - dVar17) * 0.5 + dVar17;
          }
          pdVar6 = buffer_arr;
          sVar9 = local_80;
          do {
            pdVar11 = saved_xmedian;
            if ((ulong)ABS(*pdVar6) < 0x7ff0000000000000) {
              pdVar11 = pdVar6;
            }
            *pdVar6 = *pdVar11;
            pdVar6 = pdVar6 + 1;
            sVar9 = sVar9 - 1;
          } while (sVar9 != 0);
          sVar7 = 0;
          auVar18 = _DAT_0036e1e0;
          do {
            auVar19 = auVar18 ^ auVar2;
            if ((bool)(~(auVar19._4_4_ == iVar21 && auVar20._0_4_ < auVar19._0_4_ ||
                        iVar21 < auVar19._4_4_) & 1)) {
              buffer_pos[sVar7] = sVar7;
            }
            if ((auVar19._12_4_ != iVar22 || auVar19._8_4_ <= auVar20._8_4_) &&
                auVar19._12_4_ <= iVar22) {
              buffer_pos[sVar7 + 1] = sVar7 + 1;
            }
            sVar7 = sVar7 + 2;
            lVar12 = auVar18._8_8_;
            auVar18._0_8_ = auVar18._0_8_ + 2;
            auVar18._8_8_ = lVar12 + 2;
            missing_action_00 = Fail;
          } while ((uVar15 - ((uint)local_88 & 1)) + 2 != sVar7);
          goto LAB_002cc17b;
        }
        uVar5 = uVar5 + 1;
      } while (local_80 != uVar5);
      missing_action_00 = Fail;
    }
  }
LAB_002cc17b:
  std::vector<double,_std::allocator<double>_>::vector
            (&buffer_w,local_80,(allocator_type *)&local_78);
  if (st <= (ulong)local_90) {
    lVar12 = st * 8;
    lVar13 = 0;
    do {
      local_78._M_head_impl = (unsigned_long *)((long)ix_arr + lVar13 + lVar12);
      pVar23 = tsl::detail_robin_hash::
               robin_hash<std::pair<unsigned_long,double>,tsl::robin_map<unsigned_long,double,std::hash<unsigned_long>,std::equal_to<unsigned_long>,std::allocator<std::pair<unsigned_long,double>>,false,tsl::rh::power_of_two_growth_policy<2ul>>::KeySelect,tsl::robin_map<unsigned_long,double,std::hash<unsigned_long>,std::equal_to<unsigned_long>,std::allocator<std::pair<unsigned_long,double>>,false,tsl::rh::power_of_two_growth_policy<2ul>>::ValueSelect,std::hash<unsigned_long>,std::equal_to<unsigned_long>,std::allocator<std::pair<unsigned_long,double>>,false,tsl::rh::power_of_two_growth_policy<2ul>>
               ::
               insert_impl<unsigned_long,std::piecewise_construct_t_const&,std::tuple<unsigned_long_const&>,std::tuple<>>
                         ((robin_hash<std::pair<unsigned_long,double>,tsl::robin_map<unsigned_long,double,std::hash<unsigned_long>,std::equal_to<unsigned_long>,std::allocator<std::pair<unsigned_long,double>>,false,tsl::rh::power_of_two_growth_policy<2ul>>::KeySelect,tsl::robin_map<unsigned_long,double,std::hash<unsigned_long>,std::equal_to<unsigned_long>,std::allocator<std::pair<unsigned_long,double>>,false,tsl::rh::power_of_two_growth_policy<2ul>>::ValueSelect,std::hash<unsigned_long>,std::equal_to<unsigned_long>,std::allocator<std::pair<unsigned_long,double>>,false,tsl::rh::power_of_two_growth_policy<2ul>>
                           *)w,local_78._M_head_impl,
                          (piecewise_construct_t *)&std::piecewise_construct,
                          (tuple<const_unsigned_long_&> *)&local_78,&local_91);
      *(undefined8 *)
       ((long)buffer_w.super__Vector_base<double,_std::allocator<double>_>._M_impl.
              super__Vector_impl_data._M_start + lVar13) =
           *(undefined8 *)((pVar23.first.m_bucket.m_bucket)->m_value + 8);
      st = st + 1;
      lVar13 = lVar13 + 8;
    } while (st <= (ulong)local_90);
  }
  local_90 = eval_guided_crit_weighted<double,std::vector<double,std::allocator<double>>,long_double>
                       (buffer_pos,0,local_88,buffer_arr,buffer_arr + local_80,as_relative_gain,
                        saved_xmedian,(double *)0x0,&ignored,split_point,xmin,xmax,criterion,
                        min_gain,missing_action_00,cols_use,ncols_use,force_cols_use,X_row_major,
                        ncols,Xr,Xr_ind,Xr_indptr,&buffer_w);
  if (buffer_w.super__Vector_base<double,_std::allocator<double>_>._M_impl.super__Vector_impl_data.
      _M_start != (pointer)0x0) {
    operator_delete(buffer_w.super__Vector_base<double,_std::allocator<double>_>._M_impl.
                    super__Vector_impl_data._M_start,
                    (long)buffer_w.super__Vector_base<double,_std::allocator<double>_>._M_impl.
                          super__Vector_impl_data._M_end_of_storage -
                    (long)buffer_w.super__Vector_base<double,_std::allocator<double>_>._M_impl.
                          super__Vector_impl_data._M_start);
  }
  return local_90;
}

Assistant:

double eval_guided_crit_weighted(size_t ix_arr[], size_t st, size_t end,
                                 size_t col_num, real_t_ Xc[], sparse_ix Xc_ind[], sparse_ix Xc_indptr[],
                                 double buffer_arr[], size_t buffer_pos[], bool as_relative_gain,
                                 double *restrict saved_xmedian,
                                 double &restrict split_point, double &restrict xmin, double &restrict xmax,
                                 GainCriterion criterion, double min_gain, MissingAction missing_action,
                                 size_t *restrict cols_use, size_t ncols_use, bool force_cols_use,
                                 double *restrict X_row_major, size_t ncols,
                                 double *restrict Xr, size_t *restrict Xr_ind, size_t *restrict Xr_indptr,
                                 mapping &restrict w)
{
    size_t ignored;


    todense(ix_arr, st, end,
            col_num, Xc, Xc_ind, Xc_indptr,
            buffer_arr);
    size_t tot = end - st + 1;
    std::iota(buffer_pos, buffer_pos + tot, (size_t)0);


    if (missing_action == Impute)
    {
        missing_action = Fail;
        for (size_t ix = 0; ix < tot; ix++)
        {
            if (unlikely(is_na_or_inf(buffer_arr[ix])))
            {
                goto fill_missing;
            }
        }
        goto no_nas;

        fill_missing:
        {
            size_t idx_half = div2(tot);
            std::nth_element(buffer_pos, buffer_pos + idx_half, buffer_pos + tot,
                             [&buffer_arr](const size_t a, const size_t b){return buffer_arr[a] < buffer_arr[b];});
            *saved_xmedian = buffer_arr[buffer_pos[idx_half]];

            if ((tot % 2) == 0)
            {
                double xlow = *std::max_element(buffer_pos, buffer_pos + idx_half);
                *saved_xmedian = xlow + ((*saved_xmedian)-xlow)/2.;
            }

            for (size_t ix = 0; ix < tot; ix++)
                buffer_arr[ix] = is_na_or_inf(buffer_arr[ix])? (*saved_xmedian) : buffer_arr[ix];
            std::iota(buffer_pos, buffer_pos + tot, (size_t)0);
        }
    }


    no_nas:
    /* TODO: allocate this buffer externally */
    std::vector<double> buffer_w(tot);
    for (size_t row = st; row <= end; row++)
        buffer_w[row-st] = w[ix_arr[row]];
    /* TODO: in this case, as the weights match with the order of the indices, could use a faster version
       with a weighted rel_gain function instead (not yet implemented). */
    return eval_guided_crit_weighted<double, std::vector<double>, ldouble_safe>(
                                     buffer_pos, 0, end - st, buffer_arr, buffer_arr + tot,
                                     as_relative_gain, saved_xmedian, (double*)NULL, ignored, split_point,
                                     xmin, xmax, criterion, min_gain, missing_action,
                                     cols_use, ncols_use, force_cols_use,
                                     X_row_major, ncols,
                                     Xr, Xr_ind, Xr_indptr,
                                     buffer_w);
}